

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O1

void __thiscall
helics::CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>::loadComms
          (CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker> *this)

{
  CommsInterface *this_00;
  InprocComms *this_01;
  pointer __p;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_40;
  code *local_30;
  __uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
  local_20;
  
  this_01 = (InprocComms *)operator_new(0x410);
  inproc::InprocComms::InprocComms(this_01);
  local_20._M_t.
  super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
  .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl =
       (tuple<helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>)
       (_Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
        )0x0;
  std::
  __uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>::
  reset((__uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
         *)&this->comms,this_01);
  std::unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>::
  ~unique_ptr((unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
               *)&local_20);
  local_68._8_8_ = 0;
  pcStack_50 = std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/CommsBroker_impl.hpp:53:24)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/CommsBroker_impl.hpp:53:24)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  CommsInterface::setCallback
            (&((this->comms)._M_t.
               super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
               .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl)->
              super_CommsInterface,(function<void_(helics::ActionMessage_&&)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  this_00 = &((this->comms)._M_t.
              super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
              .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl)->
             super_CommsInterface;
  BrokerBase::getLoggingCallback(&(this->super_CoreBroker).super_BrokerBase);
  CommsInterface::setLoggingCallback
            (this_00,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void CommsBroker<COMMS, BrokerT>::loadComms()
{
    comms = std::make_unique<COMMS>();
    comms->setCallback([this](ActionMessage&& M) { BrokerBase::addActionMessage(std::move(M)); });
    comms->setLoggingCallback(BrokerBase::getLoggingCallback());
}